

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

void xml_parser_error(xml_parser *parser,xml_parser_offset offset,char *message)

{
  ulong local_50;
  ulong local_38;
  size_t position;
  size_t character;
  int column;
  int row;
  char *message_local;
  xml_parser_offset offset_local;
  xml_parser *parser_local;
  
  character._4_4_ = 0;
  character._0_4_ = 0;
  if (parser->length < parser->position + (long)offset) {
    local_50 = parser->length;
  }
  else {
    local_50 = parser->position + (long)offset;
  }
  for (local_38 = 0; local_38 < local_50; local_38 = local_38 + 1) {
    character._0_4_ = (uint)character + 1;
    if (parser->buffer[local_38] == '\n') {
      character._4_4_ = character._4_4_ + 1;
      character._0_4_ = 0;
    }
  }
  if (offset == NO_CHARACTER) {
    fprintf(_stderr,"xml_parser_error at %i:%i: %s\n",(ulong)(character._4_4_ + 1),
            (ulong)(uint)character,message);
  }
  else {
    fprintf(_stderr,"xml_parser_error at %i:%i (is %c): %s\n",(ulong)(character._4_4_ + 1),
            (ulong)(uint)character,(ulong)parser->buffer[local_50],message);
  }
  return;
}

Assistant:

static void xml_parser_error(struct xml_parser* parser, enum xml_parser_offset offset, char const* message) {
	int row = 0;
	int column = 0;

	#define min(X,Y) ((X) < (Y) ? (X) : (Y))
	#define max(X,Y) ((X) > (Y) ? (X) : (Y))
	size_t character = max(0, min(parser->length, parser->position + offset));
	#undef min
	#undef max

	size_t position = 0; for (; position < character; ++position) {
		column++;

		if ('\n' == parser->buffer[position]) {
			row++;
			column = 0;
		}
	}

	if (NO_CHARACTER != offset) {
		fprintf(stderr,	"xml_parser_error at %i:%i (is %c): %s\n",
				row + 1, column, parser->buffer[character], message
		);
	} else {
		fprintf(stderr,	"xml_parser_error at %i:%i: %s\n",
				row + 1, column, message
		);
	}
}